

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O2

char * ngx_http_rewrite_if(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  char cVar1;
  u_char uVar2;
  byte bVar3;
  size_t *psVar4;
  ngx_http_core_loc_conf_t *clcf;
  ngx_uint_t nVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 *puVar9;
  void *pvVar10;
  long lVar11;
  ngx_int_t nVar12;
  char *pcVar13;
  undefined8 *puVar14;
  ngx_http_regex_t *pnVar15;
  ulong uVar16;
  code *pcVar17;
  ngx_conf_t *pnVar18;
  u_char *puVar19;
  ngx_str_t *pnVar20;
  long lVar21;
  ngx_http_rewrite_loc_conf_t *pnVar22;
  bool bVar23;
  byte bVar24;
  char *pcStack_4b0;
  u_char local_4a8 [8];
  ngx_conf_t save;
  ngx_regex_compile_t local_a8;
  ngx_int_t local_58;
  char *local_50;
  char *local_48;
  ngx_str_t *local_40;
  ngx_http_rewrite_loc_conf_t *local_38;
  
  bVar24 = 0;
  puVar9 = (undefined8 *)ngx_pcalloc(cf->pool,0x18);
  if (puVar9 == (undefined8 *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  puVar14 = (undefined8 *)cf->ctx;
  *puVar9 = *puVar14;
  puVar9[1] = puVar14[1];
  pvVar10 = ngx_pcalloc(cf->pool,ngx_http_max_module << 3);
  puVar9[2] = pvVar10;
  if (pvVar10 == (void *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  local_38 = (ngx_http_rewrite_loc_conf_t *)conf;
  for (lVar21 = 0; lVar11 = *(long *)((long)cf->cycle->modules + lVar21), lVar11 != 0;
      lVar21 = lVar21 + 8) {
    if ((*(long *)(lVar11 + 0x48) == 0x50545448) &&
       (pcVar17 = *(code **)(*(long *)(lVar11 + 0x38) + 0x30), pcVar17 != (code *)0x0)) {
      lVar11 = (*pcVar17)(cf);
      if (lVar11 == 0) {
        return (char *)0xffffffffffffffff;
      }
      *(long *)(puVar9[2] + **(long **)((long)cf->cycle->modules + lVar21) * 8) = lVar11;
    }
  }
  psVar4 = *(size_t **)(puVar14[2] + ngx_http_core_module.ctx_index * 8);
  clcf = (ngx_http_core_loc_conf_t *)((void **)puVar9[2])[ngx_http_core_module.ctx_index];
  clcf->loc_conf = (void **)puVar9[2];
  puVar19 = (u_char *)psVar4[1];
  (clcf->name).len = *psVar4;
  (clcf->name).data = puVar19;
  clcf->field_0x18 = clcf->field_0x18 | 1;
  nVar12 = ngx_http_add_location(cf,(ngx_queue_t **)(psVar4 + 0x53),clcf);
  pnVar22 = local_38;
  if (nVar12 != 0) {
    return (char *)0xffffffffffffffff;
  }
  pvVar10 = cf->args->elts;
  lVar21 = *(long *)((long)pvVar10 + 0x10);
  if ((lVar21 == 0) || (**(char **)((long)pvVar10 + 0x18) != '(')) {
    pnVar20 = (ngx_str_t *)((long)pvVar10 + 0x10);
    pcVar13 = "invalid condition \"%V\"";
    goto LAB_001679da;
  }
  nVar5 = cf->args->nelts;
  pcVar13 = (char *)(nVar5 - 1);
  if (lVar21 == 1) {
    pcStack_4b0 = (char *)0x2;
  }
  else {
    *(long *)((long)pvVar10 + 0x10) = lVar21 + -1;
    *(char **)((long)pvVar10 + 0x18) = *(char **)((long)pvVar10 + 0x18) + 1;
    pcStack_4b0 = &DAT_00000001;
  }
  pnVar20 = (ngx_str_t *)((long)pcVar13 * 0x10 + (long)pvVar10);
  lVar21 = *(long *)((long)pvVar10 + (long)pcVar13 * 0x10);
  if ((lVar21 != 0) && (pnVar20->data[lVar21 + -1] == ')')) {
    if (lVar21 == 1) {
      pcVar13 = (char *)(nVar5 - 2);
    }
    else {
      pnVar20->len = lVar21 - 1;
      pnVar20->data[lVar21 + -1] = '\0';
    }
    uVar16 = (ulong)(uint)((int)pcStack_4b0 << 4);
    pnVar20 = (ngx_str_t *)(uVar16 + (long)pvVar10);
    uVar6 = *(ulong *)((long)pvVar10 + uVar16);
    pcVar7 = *(char **)((long)pvVar10 + uVar16 + 8);
    if ((uVar6 < 2) || (*pcVar7 != '$')) {
      if (uVar6 == 3) {
        if (*pcVar7 == '!') {
          cVar1 = pcVar7[1];
          goto joined_r0x00167932;
        }
      }
      else if (uVar6 == 2) {
        cVar1 = *pcVar7;
joined_r0x00167932:
        if ((cVar1 == '-') && (pcStack_4b0 + 1 == pcVar13)) {
          lVar21 = (long)pcVar13 * 0x10;
          *(undefined1 *)(*(long *)((long)pvVar10 + lVar21 + 8) + *(long *)((long)pvVar10 + lVar21))
               = 0;
          *(long *)((long)pvVar10 + lVar21) = *(long *)((long)pvVar10 + lVar21) + 1;
          local_48 = pcVar7;
          local_40 = pnVar20;
          pcVar13 = ngx_http_rewrite_value(cf,local_38,(ngx_str_t *)(lVar21 + (long)pvVar10));
          if (pcVar13 != (char *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          puVar14 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar22->codes,0x10);
          if (puVar14 == (undefined8 *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          *puVar14 = ngx_http_script_file_code;
          cVar1 = local_48[1];
          if (cVar1 == 'd') {
            puVar14[1] = 2;
LAB_00167834:
            puVar14 = (undefined8 *)ngx_array_push_n(pnVar22->codes,0x18);
            if (puVar14 == (undefined8 *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            *puVar14 = ngx_http_script_if_code;
            local_40 = (ngx_str_t *)pnVar22->codes->elts;
            lVar21 = puVar9[2];
            local_38 = *(ngx_http_rewrite_loc_conf_t **)
                        (lVar21 + ngx_http_rewrite_module.ctx_index * 8);
            local_38->codes = pnVar22->codes;
            pnVar18 = cf;
            puVar19 = local_4a8;
            for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
              *(char **)puVar19 = pnVar18->name;
              pnVar18 = (ngx_conf_t *)((long)pnVar18 + (ulong)bVar24 * -0x10 + 8);
              puVar19 = puVar19 + ((ulong)bVar24 * -2 + 1) * 8;
            }
            cf->ctx = puVar9;
            bVar23 = cf->cmd_type != 0x4000000;
            if (!bVar23) {
              lVar21 = 0;
            }
            puVar14[2] = lVar21;
            cf->cmd_type = (ulong)((uint)bVar23 << 0x1d) + 0x20000000;
            pcVar13 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar19 = local_4a8;
            for (lVar21 = 0xc; lVar21 != 0; lVar21 = lVar21 + -1) {
              cf->name = *(char **)puVar19;
              puVar19 = puVar19 + ((ulong)bVar24 * -2 + 1) * 8;
              cf = (ngx_conf_t *)((long)cf + (ulong)bVar24 * -0x10 + 8);
            }
            if (pcVar13 != (char *)0x0) {
              return pcVar13;
            }
            pvVar10 = pnVar22->codes->elts;
            lVar21 = (long)pvVar10 - (long)local_40;
            if (lVar21 == 0) {
              lVar21 = 0;
            }
            *(ngx_uint_t *)((long)puVar14 + lVar21 + 8) =
                 (long)pvVar10 + (pnVar22->codes->nelts - ((long)puVar14 + lVar21));
            *(long *)local_38 = 0;
            return (char *)0x0;
          }
          if (cVar1 == 'e') {
            puVar14[1] = 4;
            goto LAB_00167834;
          }
          if (cVar1 == 'x') {
            puVar14[1] = 6;
            goto LAB_00167834;
          }
          if (cVar1 == 'f') {
            puVar14[1] = 0;
            goto LAB_00167834;
          }
          if (*local_48 == '!') {
            cVar1 = local_48[2];
            pnVar22 = local_38;
            if (cVar1 == 'd') {
              puVar14[1] = 3;
              goto LAB_00167834;
            }
            if (cVar1 == 'e') {
              puVar14[1] = 5;
              goto LAB_00167834;
            }
            if (cVar1 == 'x') {
              puVar14[1] = 7;
              goto LAB_00167834;
            }
            if (cVar1 == 'f') {
              puVar14[1] = 1;
              goto LAB_00167834;
            }
          }
          pcVar13 = "invalid condition \"%V\"";
          pnVar20 = local_40;
          goto LAB_001679da;
        }
      }
    }
    else if (pcStack_4b0 + 2 == pcVar13 || pcStack_4b0 == pcVar13) {
      local_50 = pcStack_4b0;
      pnVar20->len = uVar6 - 1;
      pnVar20->data = (u_char *)(pcVar7 + 1);
      local_48 = pcVar13;
      local_40 = pnVar20;
      local_58 = ngx_http_get_variable_index(cf,pnVar20);
      if (local_58 == -1) {
        return (char *)0xffffffffffffffff;
      }
      puVar14 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar22->codes,0x10);
      if (puVar14 == (undefined8 *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      *puVar14 = ngx_http_script_var_code;
      puVar14[1] = local_58;
      if (local_50 == local_48) goto LAB_00167834;
      pcVar13 = (char *)local_40[1].len;
      pnVar20 = (ngx_str_t *)local_40[1].data;
      if (pcVar13 == (char *)0x3) {
        if (((u_char)pnVar20->len == '!') && (*(u_char *)((long)&pnVar20->len + 1) == '~')) {
          uVar2 = *(u_char *)((long)&pnVar20->len + 2);
joined_r0x00167adf:
          if (uVar2 == '*') {
LAB_00167b78:
            local_50 = pcVar13;
            local_40 = pnVar20;
            puVar14 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar22->codes,0x48);
            if (puVar14 == (undefined8 *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            puVar14[6] = 0;
            puVar14[7] = 0;
            puVar14[4] = 0;
            puVar14[5] = 0;
            puVar14[2] = 0;
            puVar14[3] = 0;
            puVar14[8] = 0;
            *puVar14 = 0;
            puVar14[1] = 0;
            local_a8.name_size = 0;
            local_a8._52_4_ = 0;
            local_a8.names = (u_char *)0x0;
            local_a8.regex = (ngx_regex_t *)0x0;
            local_a8.captures = 0;
            local_a8.named_captures = 0;
            local_a8.pool = (ngx_pool_t *)0x0;
            local_48 = (char *)((long)local_48 * 0x10);
            local_a8.pattern.len = *(size_t *)(local_48 + (long)pvVar10);
            local_a8.pattern.data = *(u_char **)((long)(local_48 + (long)pvVar10) + 8);
            local_a8.options =
                 (ngx_int_t)(((undefined1 *)((long)&local_40[-1].data + 7))[(long)local_50] == '*');
            local_a8.err.len = 0x400;
            local_a8.err.data = local_4a8;
            pnVar15 = ngx_http_regex_compile(cf,&local_a8);
            puVar14[1] = pnVar15;
            if (pnVar15 == (ngx_http_regex_t *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            *puVar14 = ngx_http_script_regex_start_code;
            puVar14[5] = 0x48;
            bVar3 = *(byte *)(puVar14 + 6);
            *(byte *)(puVar14 + 6) = bVar3 | 1;
            if ((u_char)local_40->len == '!') {
              *(byte *)(puVar14 + 6) = bVar3 | 3;
            }
            uVar8 = *(undefined8 *)(local_48 + (long)pvVar10 + 8);
            puVar14[7] = *(undefined8 *)(local_48 + (long)pvVar10);
            puVar14[8] = uVar8;
            pnVar22 = local_38;
            goto LAB_00167834;
          }
        }
      }
      else if (pcVar13 == (char *)0x2) {
        uVar2 = (u_char)pnVar20->len;
        if (uVar2 == '~') {
          uVar2 = *(u_char *)((long)&pnVar20->len + 1);
          goto joined_r0x00167adf;
        }
        if (uVar2 == '!') {
          uVar2 = *(u_char *)((long)&pnVar20->len + 1);
          if (uVar2 == '~') goto LAB_00167b78;
          if (uVar2 == '=') {
            pcVar13 = ngx_http_rewrite_value
                                (cf,pnVar22,(ngx_str_t *)((long)pvVar10 + (long)local_48 * 0x10));
            if (pcVar13 != (char *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            puVar14 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar22->codes,8);
            if (puVar14 == (undefined8 *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            pcVar17 = ngx_http_script_not_equal_code;
            goto LAB_00167ac8;
          }
        }
      }
      else if (pcVar13 == &DAT_00000001) {
        uVar2 = (u_char)pnVar20->len;
        if (uVar2 == '~') goto LAB_00167b78;
        if (uVar2 == '=') {
          pcVar13 = ngx_http_rewrite_value
                              (cf,pnVar22,(ngx_str_t *)((long)pvVar10 + (long)local_48 * 0x10));
          if (pcVar13 != (char *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          puVar14 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar22->codes,8);
          if (puVar14 == (undefined8 *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          pcVar17 = ngx_http_script_equal_code;
LAB_00167ac8:
          *puVar14 = pcVar17;
          goto LAB_00167834;
        }
      }
      pnVar20 = local_40 + 1;
      pcVar13 = "unexpected \"%V\" in condition";
      goto LAB_001679da;
    }
  }
  pcVar13 = "invalid condition \"%V\"";
LAB_001679da:
  ngx_conf_log_error(1,cf,0,pcVar13,pnVar20);
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_rewrite_if(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_rewrite_loc_conf_t  *lcf = conf;

    void                         *mconf;
    char                         *rv;
    u_char                       *elts;
    ngx_uint_t                    i;
    ngx_conf_t                    save;
    ngx_http_module_t            *module;
    ngx_http_conf_ctx_t          *ctx, *pctx;
    ngx_http_core_loc_conf_t     *clcf, *pclcf;
    ngx_http_script_if_code_t    *if_code;
    ngx_http_rewrite_loc_conf_t  *nlcf;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_http_conf_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    pctx = cf->ctx;
    ctx->main_conf = pctx->main_conf;
    ctx->srv_conf = pctx->srv_conf;

    ctx->loc_conf = ngx_pcalloc(cf->pool, sizeof(void *) * ngx_http_max_module);
    if (ctx->loc_conf == NULL) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; cf->cycle->modules[i]; i++) {
        if (cf->cycle->modules[i]->type != NGX_HTTP_MODULE) {
            continue;
        }

        module = cf->cycle->modules[i]->ctx;

        if (module->create_loc_conf) {

            mconf = module->create_loc_conf(cf);
            if (mconf == NULL) {
                return NGX_CONF_ERROR;
            }

            ctx->loc_conf[cf->cycle->modules[i]->ctx_index] = mconf;
        }
    }

    pclcf = pctx->loc_conf[ngx_http_core_module.ctx_index];

    clcf = ctx->loc_conf[ngx_http_core_module.ctx_index];
    clcf->loc_conf = ctx->loc_conf;
    clcf->name = pclcf->name;
    clcf->noname = 1;

    if (ngx_http_add_location(cf, &pclcf->locations, clcf) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (ngx_http_rewrite_if_condition(cf, lcf) != NGX_CONF_OK) {
        return NGX_CONF_ERROR;
    }

    if_code = ngx_array_push_n(lcf->codes, sizeof(ngx_http_script_if_code_t));
    if (if_code == NULL) {
        return NGX_CONF_ERROR;
    }

    if_code->code = ngx_http_script_if_code;

    elts = lcf->codes->elts;


    /* the inner directives must be compiled to the same code array */

    nlcf = ctx->loc_conf[ngx_http_rewrite_module.ctx_index];
    nlcf->codes = lcf->codes;


    save = *cf;
    cf->ctx = ctx;

    if (cf->cmd_type == NGX_HTTP_SRV_CONF) {
        if_code->loc_conf = NULL;
        cf->cmd_type = NGX_HTTP_SIF_CONF;

    } else {
        if_code->loc_conf = ctx->loc_conf;
        cf->cmd_type = NGX_HTTP_LIF_CONF;
    }

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }


    if (elts != lcf->codes->elts) {
        if_code = (ngx_http_script_if_code_t *)
                   ((u_char *) if_code + ((u_char *) lcf->codes->elts - elts));
    }

    if_code->next = (u_char *) lcf->codes->elts + lcf->codes->nelts
                                                - (u_char *) if_code;

    /* the code array belong to parent block */

    nlcf->codes = NULL;

    return NGX_CONF_OK;
}